

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvidiamon.cpp
# Opt level: O0

void __thiscall nvidiamon::nvidiamon(nvidiamon *this)

{
  initializer_list<prmon::parameter> __l;
  bool bVar1;
  Imonitor *in_RDI;
  parameter *param;
  const_iterator __end1;
  const_iterator __begin1;
  parameter_list *__range1;
  parameter *in_stack_fffffffffffff9f8;
  undefined7 in_stack_fffffffffffffa00;
  undefined1 in_stack_fffffffffffffa07;
  parameter *in_stack_fffffffffffffa08;
  monitored_value *in_stack_fffffffffffffa10;
  parameter *in_stack_fffffffffffffa18;
  parameter *in_stack_fffffffffffffa20;
  string *in_stack_fffffffffffffa28;
  undefined7 in_stack_fffffffffffffa30;
  undefined1 in_stack_fffffffffffffa37;
  iterator in_stack_fffffffffffffa38;
  parameter *in_stack_fffffffffffffa40;
  undefined8 **local_590;
  level_enum *in_stack_fffffffffffffb30;
  string *in_stack_fffffffffffffb38;
  MessageBase *in_stack_fffffffffffffb40;
  nvidiamon *in_stack_fffffffffffffbe8;
  string local_3f8 [32];
  reference local_3d8;
  parameter *local_3d0;
  __normal_iterator<const_prmon::parameter_*,_std::vector<prmon::parameter,_std::allocator<prmon::parameter>_>_>
  local_3c8;
  Imonitor *local_3c0;
  allocator local_3b1;
  string local_3b0 [38];
  undefined1 local_38a;
  allocator local_389;
  string local_388 [39];
  allocator local_361;
  string local_360 [39];
  allocator local_339;
  string local_338 [39];
  allocator local_311;
  string local_310 [39];
  allocator local_2e9;
  string local_2e8 [39];
  allocator local_2c1;
  string local_2c0 [39];
  allocator local_299;
  string local_298 [39];
  allocator local_271;
  string local_270 [39];
  allocator local_249;
  string local_248 [39];
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [55];
  allocator local_1c1;
  string local_1c0 [32];
  undefined1 **local_1a0;
  undefined8 *local_198 [12];
  undefined1 local_138 [96];
  undefined1 local_d8 [96];
  undefined1 local_78 [96];
  undefined1 **local_18;
  undefined8 local_10;
  
  Imonitor::Imonitor(in_RDI);
  MessageBase::MessageBase((MessageBase *)0x35cfd5);
  in_RDI->_vptr_Imonitor = (_func_int **)&PTR__nvidiamon_003c3bb0;
  local_38a = 1;
  local_1a0 = (undefined1 **)local_198;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c0,"ngpus",&local_1c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"1",&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"1",&local_221);
  prmon::parameter::parameter
            (in_stack_fffffffffffffa40,&in_stack_fffffffffffffa38->m_name,
             (string *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
             in_stack_fffffffffffffa28);
  local_1a0 = (undefined1 **)local_138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"gpusmpct",&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"%",&local_271);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_298,"%",&local_299);
  prmon::parameter::parameter
            (in_stack_fffffffffffffa40,&in_stack_fffffffffffffa38->m_name,
             (string *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
             in_stack_fffffffffffffa28);
  local_1a0 = (undefined1 **)local_d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c0,"gpumempct",&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e8,"%",&local_2e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_310,"%",&local_311);
  prmon::parameter::parameter
            (in_stack_fffffffffffffa40,&in_stack_fffffffffffffa38->m_name,
             (string *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
             in_stack_fffffffffffffa28);
  local_1a0 = (undefined1 **)local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_338,"gpufbmem",&local_339);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_360,"kB",&local_361);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_388,"kB",&local_389);
  prmon::parameter::parameter
            (in_stack_fffffffffffffa40,&in_stack_fffffffffffffa38->m_name,
             (string *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
             in_stack_fffffffffffffa28);
  local_38a = 0;
  local_18 = (undefined1 **)local_198;
  local_10 = 4;
  std::allocator<prmon::parameter>::allocator((allocator<prmon::parameter> *)0x35d38c);
  __l._M_len = (size_type)in_stack_fffffffffffffa40;
  __l._M_array = in_stack_fffffffffffffa38;
  std::vector<prmon::parameter,_std::allocator<prmon::parameter>_>::vector
            ((vector<prmon::parameter,_std::allocator<prmon::parameter>_> *)
             CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),__l,
             (allocator_type *)in_stack_fffffffffffffa28);
  std::allocator<prmon::parameter>::~allocator((allocator<prmon::parameter> *)0x35d3c0);
  local_590 = &local_18;
  do {
    local_590 = local_590 + -0xc;
    prmon::parameter::~parameter
              ((parameter *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00));
  } while (local_590 != local_198);
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator((allocator<char> *)&local_389);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator((allocator<char> *)&local_361);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator((allocator<char> *)&local_339);
  std::__cxx11::string::~string(local_310);
  std::allocator<char>::~allocator((allocator<char> *)&local_311);
  std::__cxx11::string::~string(local_2e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  std::__cxx11::string::~string(local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>_>
         *)0x35d54d);
  *(undefined4 *)&in_RDI[0xe]._vptr_Imonitor = 0x400;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b0,"nvidiamon",&local_3b1);
  MessageBase::log_init
            (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  local_3c0 = in_RDI + 4;
  local_3c8._M_current =
       (parameter *)
       std::vector<prmon::parameter,_std::allocator<prmon::parameter>_>::begin
                 (in_stack_fffffffffffff9f8);
  local_3d0 = (parameter *)
              std::vector<prmon::parameter,_std::allocator<prmon::parameter>_>::end
                        ((vector<prmon::parameter,_std::allocator<prmon::parameter>_> *)
                         in_stack_fffffffffffff9f8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_prmon::parameter_*,_std::vector<prmon::parameter,_std::allocator<prmon::parameter>_>_>
                        *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
                       (__normal_iterator<const_prmon::parameter_*,_std::vector<prmon::parameter,_std::allocator<prmon::parameter>_>_>
                        *)in_stack_fffffffffffff9f8);
    if (!bVar1) break;
    local_3d8 = __gnu_cxx::
                __normal_iterator<const_prmon::parameter_*,_std::vector<prmon::parameter,_std::allocator<prmon::parameter>_>_>
                ::operator*(&local_3c8);
    prmon::parameter::get_name_abi_cxx11_(in_stack_fffffffffffff9f8);
    prmon::parameter::parameter(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    prmon::monitored_value::monitored_value
              (in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,(bool)in_stack_fffffffffffffa07,
               (mon_value)in_stack_fffffffffffff9f8);
    std::
    map<std::__cxx11::string,prmon::monitored_value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,prmon::monitored_value>>>
    ::emplace<std::__cxx11::string_const,prmon::monitored_value>
              ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>_>
                *)in_stack_fffffffffffffa10,&in_stack_fffffffffffffa08->m_name,
               (monitored_value *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00));
    prmon::monitored_value::~monitored_value((monitored_value *)0x35d6df);
    prmon::parameter::~parameter
              ((parameter *)CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00));
    std::__cxx11::string::~string(local_3f8);
    __gnu_cxx::
    __normal_iterator<const_prmon::parameter_*,_std::vector<prmon::parameter,_std::allocator<prmon::parameter>_>_>
    ::operator++(&local_3c8);
  }
  bVar1 = test_nvidia_smi(in_stack_fffffffffffffbe8);
  *(bool *)&in_RDI[0xd]._vptr_Imonitor = bVar1;
  return;
}

Assistant:

nvidiamon::nvidiamon() {
  log_init(MONITOR_NAME);
#undef MONITOR_NAME
  for (const auto& param : params) {
    nvidia_stats.emplace(param.get_name(), prmon::monitored_value(param));
  }

  // Attempt to execute nvidia-smi
  // If this works we are valid, but if not then we can't get data
  valid = test_nvidia_smi();
}